

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::LdexpCase::compare(LdexpCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  float a;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar9;
  ulong uVar10;
  deUint32 u32;
  double dVar11;
  Float<unsigned_int,_8,_23,_127,_3U> local_44;
  LdexpCase *local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  local_40 = this;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  uVar8 = ~(-1 << (0x17 - (&DAT_018a32ec)[(ulong)PVar2 * 4] & 0x1f));
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  do {
    if (uVar10 == uVar9) {
LAB_0126c5d0:
      return (long)(int)uVar4 <= (long)uVar9;
    }
    uVar1 = *(uint *)((long)*inputs + uVar9 * 4);
    a = *(float *)((long)*outputs + uVar9 * 4);
    dVar11 = ldexp((double)(ulong)uVar1,*(int *)((long)inputs[1] + uVar9 * 4));
    dVar5 = getUlpDiffIgnoreZeroSign(a,SUB84(dVar11,0));
    local_44.m_value = uVar1;
    iVar6 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_44);
    if (uVar8 < dVar5) {
      poVar7 = std::operator<<(&(local_40->super_CommonFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
      poVar7 = std::operator<<(poVar7,"] = ");
      local_34.value = SUB84(dVar11,0);
      poVar7 = Functional::operator<<(poVar7,&local_34);
      poVar7 = std::operator<<(poVar7,", (exp = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      poVar7 = std::operator<<(poVar7,") with ULP threshold ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar8;
      poVar7 = tcu::Format::operator<<(poVar7,hex);
      poVar7 = std::operator<<(poVar7,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = dVar5;
      tcu::Format::operator<<(poVar7,hex_00);
      goto LAB_0126c5d0;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}